

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sounddef.cpp
# Opt level: O0

void sdInit(void)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulong uVar3;
  int local_160;
  int local_15c;
  int i_9;
  int i_8;
  int i_7;
  int p;
  int i_6;
  int j_1;
  V2PARAM *p_2;
  int i_5;
  int j;
  V2PARAM *p_1;
  int local_128;
  int i_4;
  int i_3;
  int i_2;
  int i_1;
  int i;
  char s [256];
  long *local_10;
  uchar *sptr;
  
  soundmem = (uchar *)operator_new__(0x1b2d7);
  local_10 = (long *)((long)soundmem + 0x200);
  patchoffsets = (long *)soundmem;
  for (i_2 = 0; i_2 < 0x81; i_2 = i_2 + 1) {
    if (i_2 < 0x80) {
      patchoffsets[i_2] = (long)local_10 - (long)soundmem;
      sprintf((char *)&i_1,"Init Patch #%03d",(ulong)(uint)i_2);
      strcpy(patchnames[i_2],(char *)&i_1);
    }
    else {
      editmem = (uchar *)local_10;
    }
    memcpy(local_10,"@@\x01",0x357);
    local_10 = (long *)((long)local_10 + 0x357);
  }
  for (i_3 = 0; i_3 < 0x17; i_3 = i_3 + 1) {
    globals[i_3] = "@@ \x7fdP@@"[i_3];
  }
  memcpy(v2clipboard,"@@\x01",0x357);
  sprintf(v2clipname,"Init Patch");
  v2version = 0;
  for (i_4 = 0; i_4 < 0x59; i_4 = i_4 + 1) {
    if (v2version < v2parms[i_4].version) {
      v2version = v2parms[i_4].version;
    }
  }
  for (local_128 = 0; local_128 < 0x17; local_128 = local_128 + 1) {
    if (v2version < v2gparms[local_128].version) {
      v2version = v2gparms[local_128].version;
    }
  }
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)(v2version + 1);
  uVar3 = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  v2vsizes = (int *)operator_new__(uVar3);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)(v2version + 1);
  uVar3 = SUB168(auVar2 * ZEXT816(4),0);
  if (SUB168(auVar2 * ZEXT816(4),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  v2gsizes = (int *)operator_new__(uVar3);
  memset(v2vsizes,0,(long)(v2version + 1) << 2);
  memset(v2gsizes,0,(long)(v2version + 1) << 2);
  for (p_1._4_4_ = 0; p_1._4_4_ < 0x59; p_1._4_4_ = p_1._4_4_ + 1) {
    for (p_2._4_4_ = v2version; v2parms[p_1._4_4_].version <= p_2._4_4_; p_2._4_4_ = p_2._4_4_ + -1)
    {
      v2vsizes[p_2._4_4_] = v2vsizes[p_2._4_4_] + 1;
    }
  }
  for (p_2._0_4_ = 0; (int)p_2 < 0x17; p_2._0_4_ = (int)p_2 + 1) {
    for (p = v2version; v2gparms[(int)p_2].version <= p; p = p + -1) {
      v2gsizes[p] = v2gsizes[p] + 1;
    }
  }
  for (i_7 = 0; i_7 <= v2version; i_7 = i_7 + 1) {
    v2vsizes[i_7] = v2vsizes[i_7] + 0x2fe;
  }
  v2topics2 = (int *)operator_new__(0x44);
  i_8 = 0;
  for (i_9 = 0; i_9 < 0x11; i_9 = i_9 + 1) {
    v2topics2[i_9] = i_8;
    i_8 = v2topics[i_9].no + i_8;
  }
  v2gtopics2 = (int *)operator_new__(0x14);
  i_8 = 0;
  for (local_15c = 0; local_15c < 5; local_15c = local_15c + 1) {
    v2gtopics2[local_15c] = i_8;
    i_8 = v2gtopics[local_15c].no + i_8;
  }
  memset(speech,0,0x4000);
  for (local_160 = 0; local_160 < 0x40; local_160 = local_160 + 1) {
    speechptrs[local_160] = speech[local_160];
  }
  strcpy(speech[0],"!DHAX_ !kwIH_k !br4AH_UHn !fAA_ks !jAH_mps !OW!vER_ !DHAX_ !lEY!zIY_ !dAA_g ");
  return;
}

Assistant:

void sdInit()
{
    soundmem = new unsigned char [smsize + v2soundsize];
    patchoffsets = (long *)soundmem;
    unsigned char *sptr = soundmem + 128*4;

    // printf("sound size: %d\n",v2nparms);
    char s[256];

    for (int i = 0; i < 129; i++)
    {
        if (i < 128)
        {
            patchoffsets[i] = (long)(sptr - soundmem);
            sprintf(s, "Init Patch #%03d", i);
            strcpy(patchnames[i], s);
        } else
            editmem = sptr;
        memcpy(sptr, v2initsnd, v2soundsize);
        sptr += v2soundsize;
    }
    for (int i = 0; i < v2ngparms; i++)
        globals[i] = v2initglobs[i];

    memcpy(v2clipboard, v2initsnd, v2soundsize);
    sprintf(v2clipname, "Init Patch");

    // init version control
    v2version = 0;
    for (int i = 0; i < v2nparms; i++)
        if (v2parms[i].version > v2version)
            v2version = v2parms[i].version;
    for (int i = 0; i < v2ngparms; i++)
        if (v2gparms[i].version > v2version)
            v2version = v2gparms[i].version;

    v2vsizes = new int[v2version + 1];
    v2gsizes = new int[v2version + 1];
    memset(v2vsizes, 0, (v2version + 1)*sizeof(int));
    memset(v2gsizes, 0, (v2version + 1)*sizeof(int));
    for (int i = 0; i < v2nparms; i++)
    {
        const V2PARAM &p = v2parms[i];
//        ATLASSERT(p.version<=v2version);
        for (int j = v2version; j >= p.version; j--)
            v2vsizes[j]++;
    }
    for (int i = 0; i < v2ngparms; i++)
    {
        const V2PARAM &p = v2gparms[i];
        //ATLASSERT(p.version<=v2version);
        for (int j = v2version; j >= p.version; j--)
            v2gsizes[j]++;
    }
//ATLASSERT(v2vsizes[v2version]==v2nparms);

    for (int i = 0; i <= v2version; i++)
    {
        // printf("size of version %d sound bank: %d params, %d globals\n",i,v2vsizes[i],v2gsizes[i]);
        v2vsizes[i] += 1 + 255*3;
    }

    v2topics2 = new int[v2ntopics];
    int p = 0;
    for (int i = 0; i < v2ntopics; i++)
    {
        v2topics2[i] = p;
        p += v2topics[i].no;
    }

    v2gtopics2 = new int[v2ngtopics];
    p = 0;
    for (int i = 0; i < v2ngtopics; i++)
    {
        v2gtopics2[i] = p;
        p += v2gtopics[i].no;
    }

#ifdef RONAN
    memset(speech, 0, 64*256);
    for (int i = 0; i < 64; i++)
        speechptrs[i] = speech[i];

    strcpy(speech[0], "!DHAX_ !kwIH_k !br4AH_UHn !fAA_ks !jAH_mps !OW!vER_ !DHAX_ !lEY!zIY_ !dAA_g ");
#endif
}